

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyT<unsigned_short>::push_back(PropertyT<unsigned_short> *this)

{
  unsigned_short local_a;
  
  local_a = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
            (&this->data_,&local_a);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }